

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariable
          (ValidatorImpl *this,VariablePtr *variable,NameList *variableNames)

{
  IssueImpl *pIVar1;
  IssuePtr *pIVar2;
  size_type sVar3;
  bool bVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  pointer name;
  string unitsName;
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ComponentPtr component;
  IssuePtr issue_1;
  ModelPtr model;
  string local_98;
  string variableName;
  IssuePtr issue_4;
  IssuePtr issue_3;
  
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
             &variableName,
             &variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  owningComponent((ParentedEntityConstPtr *)&component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&variableName._M_string_length);
  name = (pointer)(variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
  NamedEntity::name_abi_cxx11_(&variableName,(NamedEntity *)name);
  if (variableName._M_string_length != 0) {
    name = (variableNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((variableNames->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,name,&variableName);
    if (_Var5._M_current !=
        (variableNames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      Issue::IssueImpl::create();
      pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_148,
                 (NamedEntity *)
                 component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::operator+(&local_128,"Component \'",&local_148);
      std::operator+(&local_108,&local_128,"\' contains multiple variables with the name \'");
      std::operator+(&local_168,&local_108,&variableName);
      std::operator+(&unitsName,&local_168,
                     "\'. Valid variable names must be unique to their component.");
      Issue::IssueImpl::setDescription(pIVar1,&unitsName);
      std::__cxx11::string::~string((string *)&unitsName);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      AnyCellmlElement::AnyCellmlElementImpl::setComponent
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,&component,COMPONENT);
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,VARIABLE_NAME_UNIQUE);
      name = (pointer)&issue;
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
  }
  bVar4 = isCellmlIdentifier(&variableName);
  if (!bVar4) {
    makeIssueIllegalIdentifier((ValidatorImpl *)&issue_1,name);
    pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_148,"Variable \'",&variableName);
    std::operator+(&local_128,&local_148,"\' in component \'");
    NamedEntity::name_abi_cxx11_
              ((string *)&issue,
               (NamedEntity *)
               component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    std::operator+(&local_108,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue);
    std::operator+(&local_168,&local_108,"\' does not have a valid name attribute. ");
    Issue::description_abi_cxx11_
              (&local_98,
               issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::operator+(&unitsName,&local_168,&local_98);
    Issue::IssueImpl::setDescription(pIVar1,&unitsName);
    std::__cxx11::string::~string((string *)&unitsName);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&issue);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,variable);
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,VARIABLE_NAME_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  Entity::id_abi_cxx11_
            (&unitsName,
             (Entity *)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar4 = isValidXmlName(&unitsName);
  std::__cxx11::string::~string((string *)&unitsName);
  if (!bVar4) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,variable);
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    std::operator+(&local_128,"Variable \'",&variableName);
    std::operator+(&local_108,&local_128,"\' does not have a valid \'id\' attribute, \'");
    Entity::id_abi_cxx11_
              (&local_148,
               (Entity *)
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&local_168,&local_108,&local_148);
    std::operator+(&unitsName,&local_168,"\'.");
    Issue::IssueImpl::setDescription(pIVar1,&unitsName);
    std::__cxx11::string::~string((string *)&unitsName);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  Variable::units((Variable *)&unitsName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&unitsName._M_string_length);
  if (unitsName._M_dataplus._M_p == (pointer)0x0) {
    Issue::IssueImpl::create();
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    std::operator+(&local_128,"Variable \'",&variableName);
    std::operator+(&local_108,&local_128,"\' in component \'");
    NamedEntity::name_abi_cxx11_
              (&local_148,
               (NamedEntity *)
               component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    std::operator+(&local_168,&local_108,&local_148);
    std::operator+(&unitsName,&local_168,"\' does not have any units specified.");
    Issue::IssueImpl::setDescription(pIVar1,&unitsName);
    std::__cxx11::string::~string((string *)&unitsName);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,variable);
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,VARIABLE_UNITS_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_0021ea66;
  }
  Variable::units((Variable *)&local_168);
  NamedEntity::name_abi_cxx11_(&unitsName,(NamedEntity *)local_168._M_dataplus._M_p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length);
  bVar4 = isCellmlIdentifier(&unitsName);
  if (bVar4) {
    bVar4 = isStandardUnitName(&unitsName);
    if (!bVar4) {
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Component,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                 &local_168,
                 &component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
      owningModel((ParentedEntityConstPtr *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length);
      bVar4 = Model::hasUnits(model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,&unitsName);
      if (!bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::operator+(&local_98,"Variable \'",&variableName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       &local_98,"\' in component \'");
        NamedEntity::name_abi_cxx11_
                  ((string *)&issue_1,
                   (NamedEntity *)
                   component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::operator+(&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1
                      );
        std::operator+(&local_128,&local_148,"\' has a units reference \'");
        std::operator+(&local_108,&local_128,&unitsName);
        std::operator+(&local_168,&local_108,
                       "\' which is neither standard nor defined in the parent model.");
        Issue::IssueImpl::setDescription(pIVar1,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&issue_1);
        std::__cxx11::string::~string((string *)&issue);
        std::__cxx11::string::~string((string *)&local_98);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,variable);
        Issue::IssueImpl::setReferenceRule
                  ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,VARIABLE_UNITS_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      pIVar2 = (IssuePtr *)&model;
      goto LAB_0021ea59;
    }
  }
  else {
    makeIssueIllegalIdentifier((ValidatorImpl *)&issue_4,(string *)local_168._M_dataplus._M_p);
    pIVar1 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   "Variable \'",&variableName);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   "\' in component \'");
    NamedEntity::name_abi_cxx11_
              ((string *)&model,
               (NamedEntity *)
               component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                   &local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model);
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                   "\' does not have a valid units attribute. The attribute given is \'");
    std::operator+(&local_128,&local_148,&unitsName);
    std::operator+(&local_108,&local_128,"\'. ");
    Issue::description_abi_cxx11_
              ((string *)&issue_3,
               issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::operator+(&local_168,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3);
    Issue::IssueImpl::setDescription(pIVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&issue_3);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&issue);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&issue_1);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,variable);
    Issue::IssueImpl::setReferenceRule
              ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,VARIABLE_UNITS_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_4);
    pIVar2 = &issue_4;
LAB_0021ea59:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                &pIVar2->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)->
                _M_refcount);
  }
  std::__cxx11::string::~string((string *)&unitsName);
LAB_0021ea66:
  Variable::interfaceType_abi_cxx11_
            (&unitsName,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar3 = unitsName._M_string_length;
  std::__cxx11::string::~string((string *)&unitsName);
  if (sVar3 != 0) {
    Variable::interfaceType_abi_cxx11_
              (&unitsName,
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    bVar4 = std::operator!=(&unitsName,"public");
    if (bVar4) {
      bVar4 = std::operator!=(&unitsName,"private");
      if (bVar4) {
        bVar4 = std::operator!=(&unitsName,"none");
        if (bVar4) {
          bVar4 = std::operator!=(&unitsName,"public_and_private");
          if (bVar4) {
            Issue::IssueImpl::create();
            pIVar1 = (IssueImpl *)
                     ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                     mPimpl;
            std::operator+(&local_98,"Variable \'",&variableName);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue,&local_98,"\' in component \'");
            NamedEntity::name_abi_cxx11_
                      ((string *)&issue_1,
                       (NamedEntity *)
                       component.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            std::operator+(&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issue_1);
            std::operator+(&local_128,&local_148,"\' has an invalid interface attribute value \'");
            std::operator+(&local_108,&local_128,&unitsName);
            std::operator+(&local_168,&local_108,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&issue_1);
            std::__cxx11::string::~string((string *)&issue);
            std::__cxx11::string::~string((string *)&local_98);
            AnyCellmlElement::AnyCellmlElementImpl::setVariable
                      (*(AnyCellmlElementImpl **)
                        ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                        super_Entity.mPimpl[1].mId._M_string_length,variable);
            Issue::IssueImpl::setReferenceRule
                      ((IssueImpl *)
                       ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity.mPimpl,VARIABLE_INTERFACE_VALUE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&model);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&unitsName);
  }
  Variable::initialValue_abi_cxx11_
            (&unitsName,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  std::__cxx11::string::~string((string *)&unitsName);
  if (unitsName._M_string_length != 0) {
    Variable::initialValue_abi_cxx11_
              (&unitsName,
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    bVar4 = Component::hasVariable
                      (component.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &unitsName);
    if (!bVar4) {
      bVar4 = isCellMLReal(&unitsName);
      if (!bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        std::operator+(&local_98,"Variable \'",&variableName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       &local_98,"\' in component \'");
        NamedEntity::name_abi_cxx11_
                  ((string *)&issue_1,
                   (NamedEntity *)
                   component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::operator+(&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1
                      );
        std::operator+(&local_128,&local_148,"\' has an invalid initial value \'");
        std::operator+(&local_108,&local_128,&unitsName);
        std::operator+(&local_168,&local_108,
                       "\'. Initial values must be a real number string or a variable reference.");
        Issue::IssueImpl::setDescription(pIVar1,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&issue_1);
        std::__cxx11::string::~string((string *)&issue);
        std::__cxx11::string::~string((string *)&local_98);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  (*(AnyCellmlElementImpl **)
                    ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                    mPimpl[1].mId._M_string_length,variable);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                   mPimpl,VARIABLE_INITIAL_VALUE_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&model);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    std::__cxx11::string::~string((string *)&unitsName);
  }
  std::__cxx11::string::~string((string *)&variableName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariable(const VariablePtr &variable, const NameList &variableNames)
{
    ComponentPtr component = owningComponent(variable);
    auto variableName = variable->name();
    if (!variableName.empty()) {
        if (std::find(variableNames.begin(), variableNames.end(), variableName) != variableNames.end()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Component '" + component->name() + "' contains multiple variables with the name '" + variableName + "'. Valid variable names must be unique to their component.");
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_UNIQUE);
            addIssue(issue);
        }
    }

    // Check for a valid name attribute.
    if (!isCellmlIdentifier(variableName)) {
        auto issue = makeIssueIllegalIdentifier(variableName);
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid name attribute. " + issue->description());
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_VALUE);
        addIssue(issue);
    }
    // Check for a valid identifier.
    if (!isValidXmlName(variable->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setDescription("Variable '" + variableName + "' does not have a valid 'id' attribute, '" + variable->id() + "'.");
        addIssue(issue);
    }
    // Check for a valid units attribute.
    if (variable->units() == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have any units specified.");
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
        addIssue(issue);
    } else {
        std::string unitsName = variable->units()->name();
        if (!isCellmlIdentifier(unitsName)) {
            auto issue = makeIssueIllegalIdentifier(unitsName);
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid units attribute. The attribute given is '" + unitsName + "'. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
            addIssue(issue);
        } else if (!isStandardUnitName(unitsName)) {
            ModelPtr model = owningModel(component);
            if (!model->hasUnits(unitsName)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has a units reference '" + unitsName + "' which is neither standard nor defined in the parent model.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
                addIssue(issue);
            }
        }
    }
    // Check for a valid interface attribute.
    if (!variable->interfaceType().empty()) {
        std::string interfaceType = variable->interfaceType();
        if ((interfaceType != "public") && (interfaceType != "private") && (interfaceType != "none") && (interfaceType != "public_and_private")) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid interface attribute value '" + interfaceType + "'.");
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INTERFACE_VALUE);
            addIssue(issue);
        }
    }
    // Check for a valid initial value attribute.
    if (!variable->initialValue().empty()) {
        std::string initialValue = variable->initialValue();
        // Check if initial value is a variable reference
        if (!component->hasVariable(initialValue)) {
            // Otherwise, check that the initial value can be converted to a double
            if (!isCellMLReal(initialValue)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid initial value '" + initialValue + "'. Initial values must be a real number string or a variable reference.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INITIAL_VALUE_VALUE);
                addIssue(issue);
            }
        }
    }
}